

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

void __thiscall Console::Prompt::Private::promptClear(Private *this)

{
  usize *puVar1;
  ulong uVar2;
  byte *pbVar3;
  usize i;
  ulong uVar4;
  long lVar5;
  usize uVar6;
  ulong uVar7;
  String clearCmd_1;
  String clearCmd;
  String local_a8;
  String local_80;
  String local_58;
  
  lVar5 = (long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2;
  uVar7 = ((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2) + lVar5;
  uVar2 = uVar7 / this->stdoutScreenWidth;
  if (uVar7 < this->stdoutScreenWidth) {
    local_80.data = (Data *)operator_new__(uVar7 + 0x2d);
    (local_80.data)->str = (char *)(local_80.data + 1);
    *(undefined1 *)&local_80.data[1].str = 0;
    (local_80.data)->len = 0;
    (local_80.data)->ref = 1;
    (local_80.data)->capacity = uVar7 + 0xc;
    local_a8._data.ref = 0;
    local_a8._data.str = "\x1b[?7l";
    local_a8._data.len = 5;
    local_a8.data = &local_a8._data;
    String::append(&local_80,&local_a8);
    if ((local_a8.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_a8.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_a8.data != (Data *)0x0)) {
        operator_delete__(local_a8.data);
      }
    }
    uVar6 = (local_80.data)->len + 1;
    String::detach(&local_80,(local_80.data)->len,uVar6);
    (local_80.data)->str[(local_80.data)->len] = '\r';
    (local_80.data)->len = uVar6;
    (local_80.data)->str[uVar6] = '\0';
    if (uVar7 != 0) {
      do {
        uVar6 = (local_80.data)->len + 1;
        String::detach(&local_80,(local_80.data)->len,uVar6);
        (local_80.data)->str[(local_80.data)->len] = ' ';
        (local_80.data)->len = uVar6;
        (local_80.data)->str[uVar6] = '\0';
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    uVar6 = (local_80.data)->len + 1;
    String::detach(&local_80,(local_80.data)->len,uVar6);
    (local_80.data)->str[(local_80.data)->len] = '\r';
    (local_80.data)->len = uVar6;
    (local_80.data)->str[uVar6] = '\0';
    local_a8._data.ref = 0;
    local_a8._data.str = "\x1b[?7h";
    local_a8._data.len = 5;
    local_a8.data = &local_a8._data;
    String::append(&local_80,&local_a8);
    if ((local_a8.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_a8.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_a8.data != (Data *)0x0)) {
        operator_delete__(local_a8.data);
      }
    }
    pbVar3 = (byte *)String::operator_cast_to_char_(&local_80);
    Buffer::append(&this->bufferedOutput,pbVar3,(local_80.data)->len);
  }
  else {
    uVar6 = lVar5 + this->caretPos;
    moveCursorPosition(this,uVar6,-uVar6);
    uVar6 = this->stdoutScreenWidth;
    local_80.data = (Data *)operator_new__(uVar6 + 0x23);
    (local_80.data)->str = (char *)(local_80.data + 1);
    *(undefined1 *)&local_80.data[1].str = 0;
    (local_80.data)->len = 0;
    (local_80.data)->ref = 1;
    (local_80.data)->capacity = uVar6 + 2;
    if (uVar6 != 0) {
      uVar4 = 0;
      do {
        uVar6 = (local_80.data)->len + 1;
        String::detach(&local_80,(local_80.data)->len,uVar6);
        (local_80.data)->str[(local_80.data)->len] = ' ';
        (local_80.data)->len = uVar6;
        (local_80.data)->str[uVar6] = '\0';
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->stdoutScreenWidth);
    }
    local_a8.data = &local_a8._data;
    local_a8._data.ref = 0;
    local_a8._data.str = "\n\r";
    local_a8._data.len = 2;
    String::append(&local_80,&local_a8);
    if ((local_a8.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_a8.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_a8.data != (Data *)0x0)) {
        operator_delete__(local_a8.data);
      }
    }
    local_a8.data = (Data *)operator_new__(uVar7 + uVar2 * 2 + 0x2b);
    (local_a8.data)->str = (char *)(local_a8.data + 1);
    *(undefined1 *)&local_a8.data[1].str = 0;
    (local_a8.data)->len = 0;
    (local_a8.data)->ref = 1;
    (local_a8.data)->capacity = uVar7 + uVar2 * 2 + 10;
    local_58.data = &local_58._data;
    local_58._data.ref = 0;
    local_58._data.str = "\x1b[?7l";
    local_58._data.len = 5;
    String::append(&local_a8,&local_58);
    if ((local_58.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_58.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
        operator_delete__(local_58.data);
      }
    }
    uVar4 = 0;
    do {
      String::append(&local_a8,&local_80);
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
    uVar2 = this->stdoutScreenWidth * uVar2;
    if (uVar7 != uVar2) {
      uVar4 = 0;
      do {
        uVar6 = (local_a8.data)->len + 1;
        String::detach(&local_a8,(local_a8.data)->len,uVar6);
        (local_a8.data)->str[(local_a8.data)->len] = ' ';
        (local_a8.data)->len = uVar6;
        (local_a8.data)->str[uVar6] = '\0';
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar7 - uVar2);
    }
    local_58.data = &local_58._data;
    local_58._data.ref = 0;
    local_58._data.str = "\x1b[?7h";
    local_58._data.len = 5;
    String::append(&local_a8,&local_58);
    if ((local_58.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_58.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
        operator_delete__(local_58.data);
      }
    }
    pbVar3 = (byte *)String::operator_cast_to_char_(&local_a8);
    Buffer::append(&this->bufferedOutput,pbVar3,(local_a8.data)->len);
    moveCursorPosition(this,((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2) +
                            ((long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2)
                       ,-uVar7);
    if ((local_a8.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_a8.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_a8.data != (Data *)0x0)) {
        operator_delete__(local_a8.data);
      }
    }
  }
  if ((local_80.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_80.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_80.data != (Data *)0x0)) {
      operator_delete__(local_80.data);
    }
  }
  return;
}

Assistant:

void promptClear()
  {
    usize bufferLen = prompt.size() + input.size();
    usize additionalLines = bufferLen / stdoutScreenWidth;
    if(additionalLines)
    {
      moveCursorPosition(prompt.size() + caretPos, -(ssize)(caretPos + prompt.size()));
      String clearLine(stdoutScreenWidth + 2);
      for(usize i = 0; i < stdoutScreenWidth; ++i)
        clearLine.append(' ');
      clearLine.append("\n\r");
      String clearCmd(bufferLen + additionalLines * 2
#ifndef _MSC_VER
        + 10
#endif
      );
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7l");
#endif
      for(usize i = 0; i < additionalLines; ++i)
        clearCmd.append(clearLine);
      for(usize i = 0, count = bufferLen - additionalLines * stdoutScreenWidth; i < count; ++i)
        clearCmd.append(' ');
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7h");
#endif
      writeConsole(clearCmd, clearCmd.length());
      moveCursorPosition(prompt.size() + input.size(), -(ssize)bufferLen);
    }
    else
    {
      String clearCmd(2 + bufferLen
#ifndef _MSC_VER
        + 10
#endif
      );
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7l");
#endif
      clearCmd.append('\r');
      for(usize i = 0, count = bufferLen; i < count; ++i)
        clearCmd.append(' ');
      clearCmd.append('\r');
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7h");
#endif
      writeConsole(clearCmd, clearCmd.length());
    }
  }